

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

ArrayWithPreallocation<unsigned_char,_8UL> * __thiscall
soul::ArrayWithPreallocation<unsigned_char,_8UL>::operator=
          (ArrayWithPreallocation<unsigned_char,_8UL> *this,
          ArrayWithPreallocation<unsigned_char,_8UL> *other)

{
  size_t i;
  ulong uVar1;
  ulong uVar2;
  
  clear(this);
  uVar2 = other->numAllocated;
  if (uVar2 < 9) {
    uVar2 = other->numActive;
    this->numActive = uVar2;
    for (uVar1 = 0; uVar1 < uVar2; uVar1 = uVar1 + 1) {
      this->items[uVar1] = other->items[uVar1];
      uVar2 = this->numActive;
    }
  }
  else {
    this->items = other->items;
    this->numActive = other->numActive;
    this->numAllocated = uVar2;
    other->items = (uchar *)other->space;
    other->numAllocated = 8;
    other->numActive = 0;
  }
  return this;
}

Assistant:

ArrayWithPreallocation& operator= (ArrayWithPreallocation&& other) noexcept
    {
        clear();

        if (other.isHeapAllocated())
        {
            items = other.items;
            numActive = other.numActive;
            numAllocated = other.numAllocated;
            other.resetToInternalStorage();
            other.numActive = 0;
        }
        else
        {
            numActive = other.numActive;

            for (size_t i = 0; i < numActive; ++i)
                new (items + i) Item (std::move (other.items[i]));
        }

        return *this;
    }